

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall gnuplotio::GnuplotTmpfile::GnuplotTmpfile(GnuplotTmpfile *this,bool _debug_messages)

{
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  path pStack_78;
  path local_58;
  path local_38;
  
  boost::filesystem::temp_directory_path();
  boost::filesystem::path::path(&pStack_78,"tmp-gnuplot-%%%%-%%%%-%%%%-%%%%");
  boost::filesystem::operator/(&local_38,&local_58,&pStack_78);
  boost::filesystem::unique_path(&this->file,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  this->debug_messages = _debug_messages;
  if (_debug_messages) {
    os = std::operator<<((ostream *)&std::cerr,"create tmpfile ");
    pbVar1 = boost::filesystem::operator<<(os,&this->file);
    std::endl<char,std::char_traits<char>>(pbVar1);
  }
  return;
}

Assistant:

explicit GnuplotTmpfile(bool _debug_messages) :
        file(boost::filesystem::unique_path(
            boost::filesystem::temp_directory_path() /
            "tmp-gnuplot-%%%%-%%%%-%%%%-%%%%")),
        debug_messages(_debug_messages)
    {
        if(debug_messages) {
            std::cerr << "create tmpfile " << file << std::endl;
        }
    }